

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_subtract_average_8x4_c(uint16_t *src,int16_t *dst)

{
  subtract_average_c(src,dst,8,4,0x10,5);
  return;
}

Assistant:

CFL_SUB_AVG_FN(c)

static inline int cfl_idx_to_alpha(uint8_t alpha_idx, int8_t joint_sign,
                                   CFL_PRED_TYPE pred_type) {
  const int alpha_sign = (pred_type == CFL_PRED_U) ? CFL_SIGN_U(joint_sign)
                                                   : CFL_SIGN_V(joint_sign);
  if (alpha_sign == CFL_SIGN_ZERO) return 0;
  const int abs_alpha_q3 =
      (pred_type == CFL_PRED_U) ? CFL_IDX_U(alpha_idx) : CFL_IDX_V(alpha_idx);
  return (alpha_sign == CFL_SIGN_POS) ? abs_alpha_q3 + 1 : -abs_alpha_q3 - 1;
}